

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

DWARFCompileUnit * __thiscall
llvm::DWARFContext::getDWOCompileUnitForHash(DWARFContext *this,uint64_t Hash)

{
  uint32_t uVar1;
  uint uVar2;
  void *pvVar3;
  DWARFUnitIndex *this_00;
  Entry *E;
  DWARFUnit *pDVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 Id;
  int iVar5;
  long lVar6;
  DWARFUnit *pDVar7;
  DWARFUnit *unaff_R14;
  long lVar8;
  Optional<unsigned_long> OVar9;
  Optional<llvm::DWARFFormValue> local_88;
  DWARFDie local_50;
  long local_40;
  DWARFUnit *local_38;
  
  parseDWOUnits(this,true);
  this_00 = getCUIndex(this);
  uVar1 = (this_00->Header).NumBuckets;
  if (uVar1 != 0) {
    E = DWARFUnitIndex::getFromHash(this_00,Hash);
    if ((E == (Entry *)0x0) ||
       (pDVar4 = DWARFUnitVector::getUnitForIndexEntry(&this->DWOUnits,E),
       pDVar4 == (DWARFUnit *)0x0)) {
      unaff_R14 = (DWARFUnit *)0x0;
    }
    else {
      unaff_R14 = (DWARFUnit *)0x0;
      if (((pDVar4->Header).UnitType & 0xfb) != 2) {
        unaff_R14 = pDVar4;
      }
    }
  }
  if (uVar1 == 0) {
    parseDWOUnits(this,false);
    uVar2 = (this->DWOUnits).NumInfoUnits;
    if (uVar2 == 0xffffffff) {
      uVar2 = (this->DWOUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.Size;
    }
    if (uVar2 != 0) {
      pvVar3 = (this->DWOUnits).
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               .
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX;
      lVar6 = (ulong)uVar2 << 3;
      lVar8 = 0;
      local_40 = lVar6;
      local_38 = unaff_R14;
      do {
        pDVar4 = *(DWARFUnit **)((long)pvVar3 + lVar8);
        DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
        if (((pDVar4->Header).DWOId.Storage.hasVal & 1U) == 0) {
          pDVar4 = *(DWARFUnit **)((long)pvVar3 + lVar8);
          DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
          local_50.Die = (pDVar4->DieArray).
                         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pDVar7 = (DWARFUnit *)0x0;
          local_50.U = pDVar4;
          if ((DWARFUnit *)local_50.Die ==
              (DWARFUnit *)
              (pDVar4->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_50.Die = (DWARFDebugInfoEntry *)pDVar7;
            local_50.U = pDVar7;
          }
          DWARFDie::find(&local_88,&local_50,DW_AT_GNU_dwo_id);
          Id.value = 0;
          if (local_88.Storage.hasVal == true) {
            OVar9 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&local_88);
            Id = OVar9.Storage.field_0;
            pDVar7 = (DWARFUnit *)(ulong)OVar9.Storage._8_4_;
          }
          iVar5 = 3;
          if (((ulong)pDVar7 & 1) != 0) {
            DWARFUnitHeader::setDWOId
                      ((DWARFUnitHeader *)(*(long *)((long)pvVar3 + lVar8) + 0x18),Id.value);
            iVar5 = 0;
          }
          lVar6 = local_40;
          if (((ulong)pDVar7 & 1) != 0) goto LAB_00aef8ab;
        }
        else {
LAB_00aef8ab:
          pDVar4 = *(DWARFUnit **)((long)pvVar3 + lVar8);
          DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
          iVar5 = 0;
          if ((((pDVar4->Header).DWOId.Storage.hasVal & 1U) != 0) &&
             ((pDVar4->Header).DWOId.Storage.field_0.value == Hash)) {
            pDVar4 = *(DWARFUnit **)((long)pvVar3 + lVar8);
            if (pDVar4 == (DWARFUnit *)0x0) {
              __assert_fail("Val && \"isa<> used on a null pointer\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x69,
                            "static bool llvm::isa_impl_cl<llvm::DWARFCompileUnit, const llvm::DWARFUnit *>::doit(const From *) [To = llvm::DWARFCompileUnit, From = const llvm::DWARFUnit *]"
                           );
            }
            local_38 = (DWARFUnit *)0x0;
            if (((pDVar4->Header).UnitType & 0xfb) != 2) {
              local_38 = pDVar4;
            }
            iVar5 = 1;
          }
        }
        if ((iVar5 != 3) && (iVar5 != 0)) {
          return (DWARFCompileUnit *)local_38;
        }
        lVar8 = lVar8 + 8;
      } while (lVar6 != lVar8);
    }
    unaff_R14 = (DWARFUnit *)0x0;
  }
  return (DWARFCompileUnit *)unaff_R14;
}

Assistant:

DWARFCompileUnit *DWARFContext::getDWOCompileUnitForHash(uint64_t Hash) {
  parseDWOUnits(LazyParse);

  if (const auto &CUI = getCUIndex()) {
    if (const auto *R = CUI.getFromHash(Hash))
      return dyn_cast_or_null<DWARFCompileUnit>(
          DWOUnits.getUnitForIndexEntry(*R));
    return nullptr;
  }

  // If there's no index, just search through the CUs in the DWO - there's
  // probably only one unless this is something like LTO - though an in-process
  // built/cached lookup table could be used in that case to improve repeated
  // lookups of different CUs in the DWO.
  for (const auto &DWOCU : dwo_compile_units()) {
    // Might not have parsed DWO ID yet.
    if (!DWOCU->getDWOId()) {
      if (Optional<uint64_t> DWOId =
          toUnsigned(DWOCU->getUnitDIE().find(DW_AT_GNU_dwo_id)))
        DWOCU->setDWOId(*DWOId);
      else
        // No DWO ID?
        continue;
    }
    if (DWOCU->getDWOId() == Hash)
      return dyn_cast<DWARFCompileUnit>(DWOCU.get());
  }
  return nullptr;
}